

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_junit_xml_tests.cpp
# Opt level: O0

void __thiscall iu_Test_x_iutest_x_Fail_Test::Body(iu_Test_x_iutest_x_Fail_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_3c0;
  Fixed local_390;
  int local_208 [2];
  undefined1 local_200 [8];
  AssertionResult iutest_ar;
  AssertionHelper local_1c8;
  Fixed local_198;
  iu_Test_x_iutest_x_Fail_Test *local_10;
  iu_Test_x_iutest_x_Fail_Test *this_local;
  
  local_10 = this;
  memset(&local_198,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_198);
  iutest::AssertionHelper::AssertionHelper
            (&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
             ,0x2f,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_1c8,&local_198);
  iutest::AssertionHelper::~AssertionHelper(&local_1c8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_198);
  iutest::detail::AlwaysZero();
  local_208[1] = 2;
  local_208[0] = 3;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_200,"2","3",local_208 + 1,local_208);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    memset(&local_390,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_390);
    message = iutest::AssertionResult::message((AssertionResult *)local_200);
    iutest::AssertionHelper::AssertionHelper
              (&local_3c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
               ,0x30,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_3c0,&local_390);
    iutest::AssertionHelper::~AssertionHelper(&local_3c0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_390);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  return;
}

Assistant:

IUTEST(Test, Fail)
{
    IUTEST_SUCCEED();
    IUTEST_ASSERT_EQ(2, 3);
}